

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<4,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  uint uVar15;
  void *in_R8;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  float fVar22;
  float fVar29;
  float fVar30;
  vint4 bi;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar32;
  float fVar39;
  float fVar40;
  vint4 bi_2;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar41;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar42;
  void *pvVar43;
  float fVar51;
  vint4 bi_1;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar50;
  float fVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar53;
  vfloat4 a0;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vint4 ai_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 ai;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  vint4 ai_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  float fVar84;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar85 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  float fVar92;
  undefined1 auVar93 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar94 [64];
  undefined1 auVar98 [16];
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10e8 [16];
  RayHit *local_10d0;
  Intersectors *local_10c8;
  RayQueryContext *local_10c0;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_10c0 = context;
  local_10c8 = This;
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar24 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    auVar23 = vrsqrtss_avx(auVar24,auVar24);
    fVar53 = auVar23._0_4_;
    local_fb8[0] = fVar53 * 1.5 - auVar24._0_4_ * 0.5 * fVar53 * fVar53 * fVar53;
    local_1038 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fStack_1034 = local_1038;
    fStack_1030 = local_1038;
    fStack_102c = local_1038;
    local_1048 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fStack_1044 = local_1048;
    fStack_1040 = local_1048;
    fStack_103c = local_1048;
    local_1058 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_1054 = local_1058;
    fStack_1050 = local_1058;
    fStack_104c = local_1058;
    auVar44 = vshufps_avx(ZEXT416((uint)local_fb8[0]),ZEXT416((uint)local_fb8[0]),0);
    auVar54._0_4_ = aVar4.x * auVar44._0_4_;
    auVar54._4_4_ = aVar4.y * auVar44._4_4_;
    auVar54._8_4_ = aVar4.z * auVar44._8_4_;
    auVar54._12_4_ = aVar4.field_3.w * auVar44._12_4_;
    auVar23 = vshufpd_avx(auVar54,auVar54,1);
    auVar24 = vmovshdup_avx(auVar54);
    auVar78._8_4_ = 0x80000000;
    auVar78._0_8_ = 0x8000000080000000;
    auVar78._12_4_ = 0x80000000;
    auVar60._12_4_ = 0;
    auVar60._0_12_ = ZEXT812(0);
    auVar60 = auVar60 << 0x20;
    auVar74 = vunpckhps_avx(auVar54,auVar60);
    auVar19 = vshufps_avx(auVar74,ZEXT416(auVar24._0_4_ ^ 0x80000000),0x41);
    auVar74._0_8_ = auVar23._0_8_ ^ 0x8000000080000000;
    auVar74._8_8_ = auVar78._8_8_ ^ auVar23._8_8_;
    auVar74 = vinsertps_avx(auVar74,auVar54,0x2a);
    auVar24 = vdpps_avx(auVar19,auVar19,0x7f);
    auVar23 = vdpps_avx(auVar74,auVar74,0x7f);
    auVar24 = vcmpps_avx(auVar23,auVar24,1);
    auVar24 = vshufps_avx(auVar24,auVar24,0);
    auVar24 = vblendvps_avx(auVar74,auVar19,auVar24);
    auVar23 = vdpps_avx(auVar24,auVar24,0x7f);
    auVar74 = vrsqrtss_avx(auVar23,auVar23);
    fVar53 = auVar74._0_4_;
    auVar23 = ZEXT416((uint)(fVar53 * 1.5 - auVar23._0_4_ * 0.5 * fVar53 * fVar53 * fVar53));
    auVar23 = vshufps_avx(auVar23,auVar23,0);
    auVar75._0_4_ = auVar23._0_4_ * auVar24._0_4_;
    auVar75._4_4_ = auVar23._4_4_ * auVar24._4_4_;
    auVar75._8_4_ = auVar23._8_4_ * auVar24._8_4_;
    auVar75._12_4_ = auVar23._12_4_ * auVar24._12_4_;
    auVar24 = vshufps_avx(auVar75,auVar75,0xc9);
    auVar23 = vshufps_avx(auVar54,auVar54,0xc9);
    auVar82._0_4_ = auVar23._0_4_ * auVar75._0_4_;
    auVar82._4_4_ = auVar23._4_4_ * auVar75._4_4_;
    auVar82._8_4_ = auVar23._8_4_ * auVar75._8_4_;
    auVar82._12_4_ = auVar23._12_4_ * auVar75._12_4_;
    auVar79._0_4_ = auVar24._0_4_ * auVar54._0_4_;
    auVar79._4_4_ = auVar24._4_4_ * auVar54._4_4_;
    auVar79._8_4_ = auVar24._8_4_ * auVar54._8_4_;
    auVar79._12_4_ = auVar24._12_4_ * auVar54._12_4_;
    auVar24 = vsubps_avx(auVar79,auVar82);
    auVar74 = vshufps_avx(auVar24,auVar24,0xc9);
    auVar24 = vdpps_avx(auVar74,auVar74,0x7f);
    auVar23 = vrsqrtss_avx(auVar24,auVar24);
    fVar53 = auVar23._0_4_;
    auVar24 = ZEXT416((uint)(fVar53 * 1.5 - auVar24._0_4_ * 0.5 * fVar53 * fVar53 * fVar53));
    auVar24 = vshufps_avx(auVar24,auVar24,0);
    auVar23._0_4_ = auVar74._0_4_ * auVar24._0_4_;
    auVar23._4_4_ = auVar74._4_4_ * auVar24._4_4_;
    auVar23._8_4_ = auVar74._8_4_ * auVar24._8_4_;
    auVar23._12_4_ = auVar74._12_4_ * auVar24._12_4_;
    auVar24._0_4_ = auVar44._0_4_ * auVar54._0_4_;
    auVar24._4_4_ = auVar44._4_4_ * auVar54._4_4_;
    auVar24._8_4_ = auVar44._8_4_ * auVar54._8_4_;
    auVar24._12_4_ = auVar44._12_4_ * auVar54._12_4_;
    auVar74 = vunpcklps_avx(auVar75,auVar24);
    auVar24 = vunpckhps_avx(auVar75,auVar24);
    auVar44 = vunpcklps_avx(auVar23,auVar60);
    auVar23 = vunpckhps_avx(auVar23,auVar60);
    local_f88 = vunpcklps_avx(auVar24,auVar23);
    local_fa8 = vunpcklps_avx(auVar74,auVar44);
    local_f98 = vunpckhps_avx(auVar74,auVar44);
    pauVar13 = (undefined1 (*) [16])local_f68;
    auVar23 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar74 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    uStack_f70 = 0;
    auVar44._8_4_ = 0x7fffffff;
    auVar44._0_8_ = 0x7fffffff7fffffff;
    auVar44._12_4_ = 0x7fffffff;
    auVar24 = vandps_avx((undefined1  [16])aVar4,auVar44);
    auVar61._8_4_ = 0x219392ef;
    auVar61._0_8_ = 0x219392ef219392ef;
    auVar61._12_4_ = 0x219392ef;
    auVar24 = vcmpps_avx(auVar24,auVar61,1);
    auVar24 = vblendvps_avx((undefined1  [16])aVar4,auVar61,auVar24);
    auVar44 = vrcpps_avx(auVar24);
    fVar53 = auVar44._0_4_;
    auVar19._0_4_ = auVar24._0_4_ * fVar53;
    fVar42 = auVar44._4_4_;
    auVar19._4_4_ = auVar24._4_4_ * fVar42;
    fVar32 = auVar44._8_4_;
    auVar19._8_4_ = auVar24._8_4_ * fVar32;
    fVar22 = auVar44._12_4_;
    auVar19._12_4_ = auVar24._12_4_ * fVar22;
    auVar62._8_4_ = 0x3f800000;
    auVar62._0_8_ = 0x3f8000003f800000;
    auVar62._12_4_ = 0x3f800000;
    auVar24 = vsubps_avx(auVar62,auVar19);
    auVar20._0_4_ = fVar53 + fVar53 * auVar24._0_4_;
    auVar20._4_4_ = fVar42 + fVar42 * auVar24._4_4_;
    auVar20._8_4_ = fVar32 + fVar32 * auVar24._8_4_;
    auVar20._12_4_ = fVar22 + fVar22 * auVar24._12_4_;
    uVar3 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_1068._4_4_ = uVar3;
    local_1068._0_4_ = uVar3;
    local_1068._8_4_ = uVar3;
    local_1068._12_4_ = uVar3;
    auVar85 = ZEXT1664(local_1068);
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_1078._4_4_ = uVar3;
    local_1078._0_4_ = uVar3;
    local_1078._8_4_ = uVar3;
    local_1078._12_4_ = uVar3;
    auVar94 = ZEXT1664(local_1078);
    fVar53 = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar76._4_4_ = fVar53;
    auVar76._0_4_ = fVar53;
    auVar76._8_4_ = fVar53;
    auVar76._12_4_ = fVar53;
    local_1088 = vshufps_avx(auVar20,auVar20,0);
    auVar81 = ZEXT1664(local_1088);
    auVar24 = vmovshdup_avx(auVar20);
    local_1098 = vshufps_avx(auVar20,auVar20,0x55);
    auVar83 = ZEXT1664(local_1098);
    uVar16 = (ulong)(auVar20._0_4_ < 0.0) * 0x10;
    auVar44 = vshufpd_avx(auVar20,auVar20,1);
    local_10a8 = vshufps_avx(auVar20,auVar20,0xaa);
    auVar89 = ZEXT1664(local_10a8);
    uVar18 = (ulong)(auVar24._0_4_ < 0.0) << 4 | 0x20;
    uVar17 = (ulong)(auVar44._0_4_ < 0.0) << 4 | 0x40;
    local_10b8 = vshufps_avx(auVar23,auVar23,0);
    auVar90 = ZEXT1664(local_10b8);
    auVar24 = vshufps_avx(auVar74,auVar74,0);
    auVar21 = ZEXT1664(auVar24);
    local_10d0 = ray;
    do {
      pauVar12 = pauVar13 + -1;
      pauVar13 = pauVar13 + -1;
      if (*(float *)(*pauVar12 + 8) <= (ray->super_RayK<1>).tfar) {
        pvVar43 = *(void **)*pauVar13;
        while (((ulong)pvVar43 & 8) == 0) {
          fVar42 = (ray->super_RayK<1>).dir.field_0.m128[3];
          uVar15 = (uint)pvVar43 & 7;
          uVar14 = (ulong)pvVar43 & 0xfffffffffffffff0;
          if (uVar15 == 3) {
            local_1008 = *(float *)(uVar14 + 0x20);
            fStack_1004 = *(float *)(uVar14 + 0x24);
            fStack_1000 = *(float *)(uVar14 + 0x28);
            fStack_ffc = *(float *)(uVar14 + 0x2c);
            local_1018 = *(float *)(uVar14 + 0x60);
            fStack_1014 = *(float *)(uVar14 + 100);
            fStack_1010 = *(float *)(uVar14 + 0x68);
            fStack_100c = *(float *)(uVar14 + 0x6c);
            local_ff8 = *(float *)(uVar14 + 0x70);
            fStack_ff4 = *(float *)(uVar14 + 0x74);
            fStack_ff0 = *(float *)(uVar14 + 0x78);
            fStack_fec = *(float *)(uVar14 + 0x7c);
            auVar24 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
            fVar39 = auVar24._0_4_;
            fVar29 = auVar24._4_4_;
            fVar51 = auVar24._8_4_;
            fVar40 = auVar24._12_4_;
            fVar42 = 1.0 - fVar42;
            auVar24 = vshufps_avx(ZEXT416((uint)(fVar42 * 0.0)),ZEXT416((uint)(fVar42 * 0.0)),0);
            local_fc8 = auVar24._0_4_;
            local_fe8 = local_fc8 + fVar39 * *(float *)(uVar14 + 0xe0);
            fStack_fc4 = auVar24._4_4_;
            fStack_fe4 = fStack_fc4 + fVar29 * *(float *)(uVar14 + 0xe4);
            fStack_fc0 = auVar24._8_4_;
            fStack_fe0 = fStack_fc0 + fVar51 * *(float *)(uVar14 + 0xe8);
            fStack_fbc = auVar24._12_4_;
            fStack_fdc = fStack_fbc + fVar40 * *(float *)(uVar14 + 0xec);
            local_fd8 = local_fc8 + fVar39 * *(float *)(uVar14 + 0xf0);
            fStack_fd4 = fStack_fc4 + fVar29 * *(float *)(uVar14 + 0xf4);
            fStack_fd0 = fStack_fc0 + fVar51 * *(float *)(uVar14 + 0xf8);
            fStack_fcc = fStack_fbc + fVar40 * *(float *)(uVar14 + 0xfc);
            local_fc8 = local_fc8 + fVar39 * *(float *)(uVar14 + 0x100);
            fStack_fc4 = fStack_fc4 + fVar29 * *(float *)(uVar14 + 0x104);
            fStack_fc0 = fStack_fc0 + fVar51 * *(float *)(uVar14 + 0x108);
            fStack_fbc = fStack_fbc + fVar40 * *(float *)(uVar14 + 0x10c);
            auVar35._0_4_ =
                 local_1038 * local_1008 +
                 local_1048 * *(float *)(uVar14 + 0x50) + *(float *)(uVar14 + 0x80) * local_1058;
            auVar35._4_4_ =
                 fStack_1034 * fStack_1004 +
                 fStack_1044 * *(float *)(uVar14 + 0x54) + *(float *)(uVar14 + 0x84) * fStack_1054;
            auVar35._8_4_ =
                 fStack_1030 * fStack_1000 +
                 fStack_1040 * *(float *)(uVar14 + 0x58) + *(float *)(uVar14 + 0x88) * fStack_1050;
            auVar35._12_4_ =
                 fStack_102c * fStack_ffc +
                 fStack_103c * *(float *)(uVar14 + 0x5c) + *(float *)(uVar14 + 0x8c) * fStack_104c;
            auVar47._0_4_ =
                 *(float *)(uVar14 + 0x30) * local_1038 +
                 local_1018 * local_1048 + *(float *)(uVar14 + 0x90) * local_1058;
            auVar47._4_4_ =
                 *(float *)(uVar14 + 0x34) * fStack_1034 +
                 fStack_1014 * fStack_1044 + *(float *)(uVar14 + 0x94) * fStack_1054;
            auVar47._8_4_ =
                 *(float *)(uVar14 + 0x38) * fStack_1030 +
                 fStack_1010 * fStack_1040 + *(float *)(uVar14 + 0x98) * fStack_1050;
            auVar47._12_4_ =
                 *(float *)(uVar14 + 0x3c) * fStack_102c +
                 fStack_100c * fStack_103c + *(float *)(uVar14 + 0x9c) * fStack_104c;
            auVar93._0_4_ =
                 *(float *)(uVar14 + 0x40) * local_1038 +
                 local_1048 * local_ff8 + *(float *)(uVar14 + 0xa0) * local_1058;
            auVar93._4_4_ =
                 *(float *)(uVar14 + 0x44) * fStack_1034 +
                 fStack_1044 * fStack_ff4 + *(float *)(uVar14 + 0xa4) * fStack_1054;
            auVar93._8_4_ =
                 *(float *)(uVar14 + 0x48) * fStack_1030 +
                 fStack_1040 * fStack_ff0 + *(float *)(uVar14 + 0xa8) * fStack_1050;
            auVar93._12_4_ =
                 *(float *)(uVar14 + 0x4c) * fStack_102c +
                 fStack_103c * fStack_fec + *(float *)(uVar14 + 0xac) * fStack_104c;
            auVar65._8_4_ = 0x7fffffff;
            auVar65._0_8_ = 0x7fffffff7fffffff;
            auVar65._12_4_ = 0x7fffffff;
            auVar24 = vandps_avx(auVar35,auVar65);
            auVar25._8_4_ = 0x219392ef;
            auVar25._0_8_ = 0x219392ef219392ef;
            auVar25._12_4_ = 0x219392ef;
            auVar24 = vcmpps_avx(auVar24,auVar25,1);
            auVar23 = vblendvps_avx(auVar35,auVar25,auVar24);
            auVar24 = vandps_avx(auVar47,auVar65);
            auVar24 = vcmpps_avx(auVar24,auVar25,1);
            auVar74 = vblendvps_avx(auVar47,auVar25,auVar24);
            auVar24 = vandps_avx(auVar93,auVar65);
            auVar24 = vcmpps_avx(auVar24,auVar25,1);
            auVar24 = vblendvps_avx(auVar93,auVar25,auVar24);
            auVar44 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
            fVar42 = auVar44._0_4_;
            auVar98._0_4_ = fVar42 + fVar39 * *(float *)(uVar14 + 0x110);
            fVar32 = auVar44._4_4_;
            auVar98._4_4_ = fVar32 + fVar29 * *(float *)(uVar14 + 0x114);
            fVar22 = auVar44._8_4_;
            auVar98._8_4_ = fVar22 + fVar51 * *(float *)(uVar14 + 0x118);
            fVar50 = auVar44._12_4_;
            auVar98._12_4_ = fVar50 + fVar40 * *(float *)(uVar14 + 0x11c);
            local_1028 = fVar42 + fVar39 * *(float *)(uVar14 + 0x120);
            fStack_1024 = fVar32 + fVar29 * *(float *)(uVar14 + 0x124);
            fStack_1020 = fVar22 + fVar51 * *(float *)(uVar14 + 0x128);
            fStack_101c = fVar50 + fVar40 * *(float *)(uVar14 + 300);
            auVar91._0_4_ = fVar39 * *(float *)(uVar14 + 0x130) + fVar42;
            auVar91._4_4_ = fVar29 * *(float *)(uVar14 + 0x134) + fVar32;
            auVar91._8_4_ = fVar51 * *(float *)(uVar14 + 0x138) + fVar22;
            auVar91._12_4_ = fVar40 * *(float *)(uVar14 + 0x13c) + fVar50;
            auVar44 = vrcpps_avx(auVar23);
            fVar42 = auVar44._0_4_;
            auVar36._0_4_ = auVar23._0_4_ * fVar42;
            fVar50 = auVar44._4_4_;
            auVar36._4_4_ = auVar23._4_4_ * fVar50;
            fVar51 = auVar44._8_4_;
            auVar36._8_4_ = auVar23._8_4_ * fVar51;
            fVar52 = auVar44._12_4_;
            auVar36._12_4_ = auVar23._12_4_ * fVar52;
            auVar59._8_4_ = 0x3f800000;
            auVar59._0_8_ = 0x3f8000003f800000;
            auVar59._12_4_ = 0x3f800000;
            auVar23 = vsubps_avx(auVar59,auVar36);
            fVar42 = fVar42 + fVar42 * auVar23._0_4_;
            fVar50 = fVar50 + fVar50 * auVar23._4_4_;
            fVar51 = fVar51 + fVar51 * auVar23._8_4_;
            fVar52 = fVar52 + fVar52 * auVar23._12_4_;
            auVar23 = vrcpps_avx(auVar74);
            fVar32 = auVar23._0_4_;
            auVar26._0_4_ = auVar74._0_4_ * fVar32;
            fVar39 = auVar23._4_4_;
            auVar26._4_4_ = auVar74._4_4_ * fVar39;
            fVar40 = auVar23._8_4_;
            auVar26._8_4_ = auVar74._8_4_ * fVar40;
            fVar41 = auVar23._12_4_;
            auVar26._12_4_ = auVar74._12_4_ * fVar41;
            auVar23 = vsubps_avx(auVar59,auVar26);
            fVar32 = fVar32 + fVar32 * auVar23._0_4_;
            fVar39 = fVar39 + fVar39 * auVar23._4_4_;
            fVar40 = fVar40 + fVar40 * auVar23._8_4_;
            fVar41 = fVar41 + fVar41 * auVar23._12_4_;
            auVar23 = vrcpps_avx(auVar24);
            fVar22 = auVar23._0_4_;
            auVar66._0_4_ = auVar24._0_4_ * fVar22;
            fVar29 = auVar23._4_4_;
            auVar66._4_4_ = auVar24._4_4_ * fVar29;
            fVar30 = auVar23._8_4_;
            auVar66._8_4_ = auVar24._8_4_ * fVar30;
            fVar31 = auVar23._12_4_;
            auVar66._12_4_ = auVar24._12_4_ * fVar31;
            auVar94 = ZEXT1664(local_1078);
            auVar24 = vsubps_avx(auVar59,auVar66);
            fVar22 = fVar22 + fVar22 * auVar24._0_4_;
            fVar29 = fVar29 + fVar29 * auVar24._4_4_;
            fVar30 = fVar30 + fVar30 * auVar24._8_4_;
            fVar31 = fVar31 + fVar31 * auVar24._12_4_;
            auVar85 = ZEXT1664(local_1068);
            fVar92 = local_1078._0_4_;
            fVar95 = local_1078._4_4_;
            fVar96 = local_1078._8_4_;
            fVar97 = local_1078._12_4_;
            fVar84 = local_1068._0_4_;
            fVar86 = local_1068._4_4_;
            fVar87 = local_1068._8_4_;
            fVar88 = local_1068._12_4_;
            auVar67._0_4_ =
                 fVar84 * local_1008 +
                 fVar92 * *(float *)(uVar14 + 0x50) +
                 *(float *)(uVar14 + 0x80) * fVar53 + *(float *)(uVar14 + 0xb0);
            auVar67._4_4_ =
                 fVar86 * fStack_1004 +
                 fVar95 * *(float *)(uVar14 + 0x54) +
                 *(float *)(uVar14 + 0x84) * fVar53 + *(float *)(uVar14 + 0xb4);
            auVar67._8_4_ =
                 fVar87 * fStack_1000 +
                 fVar96 * *(float *)(uVar14 + 0x58) +
                 *(float *)(uVar14 + 0x88) * fVar53 + *(float *)(uVar14 + 0xb8);
            auVar67._12_4_ =
                 fVar88 * fStack_ffc +
                 fVar97 * *(float *)(uVar14 + 0x5c) +
                 *(float *)(uVar14 + 0x8c) * fVar53 + *(float *)(uVar14 + 0xbc);
            auVar89 = ZEXT1664(local_10a8);
            auVar72._0_4_ =
                 fVar84 * *(float *)(uVar14 + 0x30) +
                 fVar92 * local_1018 +
                 *(float *)(uVar14 + 0x90) * fVar53 + *(float *)(uVar14 + 0xc0);
            auVar72._4_4_ =
                 fVar86 * *(float *)(uVar14 + 0x34) +
                 fVar95 * fStack_1014 +
                 *(float *)(uVar14 + 0x94) * fVar53 + *(float *)(uVar14 + 0xc4);
            auVar72._8_4_ =
                 fVar87 * *(float *)(uVar14 + 0x38) +
                 fVar96 * fStack_1010 +
                 *(float *)(uVar14 + 0x98) * fVar53 + *(float *)(uVar14 + 200);
            auVar72._12_4_ =
                 fVar88 * *(float *)(uVar14 + 0x3c) +
                 fVar97 * fStack_100c +
                 *(float *)(uVar14 + 0x9c) * fVar53 + *(float *)(uVar14 + 0xcc);
            auVar90 = ZEXT1664(local_10b8);
            auVar77._0_4_ =
                 fVar84 * *(float *)(uVar14 + 0x40) +
                 *(float *)(uVar14 + 0xa0) * fVar53 + *(float *)(uVar14 + 0xd0) + fVar92 * local_ff8
            ;
            auVar77._4_4_ =
                 fVar86 * *(float *)(uVar14 + 0x44) +
                 *(float *)(uVar14 + 0xa4) * fVar53 + *(float *)(uVar14 + 0xd4) +
                 fVar95 * fStack_ff4;
            auVar77._8_4_ =
                 fVar87 * *(float *)(uVar14 + 0x48) +
                 *(float *)(uVar14 + 0xa8) * fVar53 + *(float *)(uVar14 + 0xd8) +
                 fVar96 * fStack_ff0;
            auVar77._12_4_ =
                 fVar88 * *(float *)(uVar14 + 0x4c) +
                 *(float *)(uVar14 + 0xac) * fVar53 + *(float *)(uVar14 + 0xdc) +
                 fVar97 * fStack_fec;
            auVar9._4_4_ = fStack_fe4;
            auVar9._0_4_ = local_fe8;
            auVar9._8_4_ = fStack_fe0;
            auVar9._12_4_ = fStack_fdc;
            auVar24 = vsubps_avx(auVar9,auVar67);
            auVar23 = vsubps_avx(auVar98,auVar67);
            auVar10._4_4_ = fStack_fd4;
            auVar10._0_4_ = local_fd8;
            auVar10._8_4_ = fStack_fd0;
            auVar10._12_4_ = fStack_fcc;
            auVar74 = vsubps_avx(auVar10,auVar72);
            auVar8._4_4_ = fStack_1024;
            auVar8._0_4_ = local_1028;
            auVar8._8_4_ = fStack_1020;
            auVar8._12_4_ = fStack_101c;
            auVar44 = vsubps_avx(auVar8,auVar72);
            auVar11._4_4_ = fStack_fc4;
            auVar11._0_4_ = local_fc8;
            auVar11._8_4_ = fStack_fc0;
            auVar11._12_4_ = fStack_fbc;
            auVar19 = vsubps_avx(auVar11,auVar77);
            auVar60 = vsubps_avx(auVar91,auVar77);
            auVar80._0_4_ = auVar24._0_4_ * fVar42;
            auVar80._4_4_ = auVar24._4_4_ * fVar50;
            auVar80._8_4_ = auVar24._8_4_ * fVar51;
            auVar80._12_4_ = auVar24._12_4_ * fVar52;
            auVar48._0_4_ = auVar23._0_4_ * fVar42;
            auVar48._4_4_ = auVar23._4_4_ * fVar50;
            auVar48._8_4_ = auVar23._8_4_ * fVar51;
            auVar48._12_4_ = auVar23._12_4_ * fVar52;
            auVar68._0_4_ = auVar74._0_4_ * fVar32;
            auVar68._4_4_ = auVar74._4_4_ * fVar39;
            auVar68._8_4_ = auVar74._8_4_ * fVar40;
            auVar68._12_4_ = auVar74._12_4_ * fVar41;
            auVar83 = ZEXT1664(local_1098);
            auVar73._0_4_ = auVar19._0_4_ * fVar22;
            auVar73._4_4_ = auVar19._4_4_ * fVar29;
            auVar73._8_4_ = auVar19._8_4_ * fVar30;
            auVar73._12_4_ = auVar19._12_4_ * fVar31;
            auVar37._0_4_ = auVar44._0_4_ * fVar32;
            auVar37._4_4_ = auVar44._4_4_ * fVar39;
            auVar37._8_4_ = auVar44._8_4_ * fVar40;
            auVar37._12_4_ = auVar44._12_4_ * fVar41;
            auVar27._0_4_ = auVar60._0_4_ * fVar22;
            auVar27._4_4_ = auVar60._4_4_ * fVar29;
            auVar27._8_4_ = auVar60._8_4_ * fVar30;
            auVar27._12_4_ = auVar60._12_4_ * fVar31;
            auVar24 = vpminsd_avx(auVar68,auVar37);
            auVar23 = vpminsd_avx(auVar73,auVar27);
            auVar24 = vmaxps_avx(auVar24,auVar23);
            auVar19 = vpminsd_avx(auVar80,auVar48);
            auVar44 = vpmaxsd_avx(auVar80,auVar48);
            auVar81 = ZEXT1664(local_1088);
            auVar23 = vpmaxsd_avx(auVar68,auVar37);
            auVar74 = vpmaxsd_avx(auVar73,auVar27);
            auVar74 = vminps_avx(auVar23,auVar74);
            auVar23 = vmaxps_avx(local_10b8,auVar19);
            local_10e8 = vmaxps_avx(auVar23,auVar24);
            auVar24 = vminps_avx(auVar21._0_16_,auVar44);
            auVar24 = vminps_avx(auVar24,auVar74);
            auVar24 = vcmpps_avx(local_10e8,auVar24,2);
            uVar15 = vmovmskps_avx(auVar24);
          }
          else {
            auVar44 = vshufps_avx(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42),0);
            pfVar2 = (float *)(uVar14 + 0x80 + uVar16);
            fVar42 = auVar44._0_4_;
            fVar32 = auVar44._4_4_;
            fVar22 = auVar44._8_4_;
            fVar50 = auVar44._12_4_;
            pfVar1 = (float *)(uVar14 + 0x20 + uVar16);
            auVar33._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar33._4_4_ = fVar32 * pfVar2[1] + pfVar1[1];
            auVar33._8_4_ = fVar22 * pfVar2[2] + pfVar1[2];
            auVar33._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar24 = vsubps_avx(auVar33,auVar85._0_16_);
            pfVar2 = (float *)(uVar14 + 0x80 + uVar18);
            auVar34._0_4_ = auVar81._0_4_ * auVar24._0_4_;
            auVar34._4_4_ = auVar81._4_4_ * auVar24._4_4_;
            auVar34._8_4_ = auVar81._8_4_ * auVar24._8_4_;
            auVar34._12_4_ = auVar81._12_4_ * auVar24._12_4_;
            pfVar1 = (float *)(uVar14 + 0x20 + uVar18);
            auVar45._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar45._4_4_ = fVar32 * pfVar2[1] + pfVar1[1];
            auVar45._8_4_ = fVar22 * pfVar2[2] + pfVar1[2];
            auVar45._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar24 = vsubps_avx(auVar45,auVar94._0_16_);
            pfVar2 = (float *)(uVar14 + 0x80 + uVar17);
            pfVar1 = (float *)(uVar14 + 0x20 + uVar17);
            auVar55._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar55._4_4_ = fVar32 * pfVar2[1] + pfVar1[1];
            auVar55._8_4_ = fVar22 * pfVar2[2] + pfVar1[2];
            auVar55._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar46._0_4_ = auVar83._0_4_ * auVar24._0_4_;
            auVar46._4_4_ = auVar83._4_4_ * auVar24._4_4_;
            auVar46._8_4_ = auVar83._8_4_ * auVar24._8_4_;
            auVar46._12_4_ = auVar83._12_4_ * auVar24._12_4_;
            auVar24 = vsubps_avx(auVar55,auVar76);
            auVar56._0_4_ = auVar89._0_4_ * auVar24._0_4_;
            auVar56._4_4_ = auVar89._4_4_ * auVar24._4_4_;
            auVar56._8_4_ = auVar89._8_4_ * auVar24._8_4_;
            auVar56._12_4_ = auVar89._12_4_ * auVar24._12_4_;
            auVar24 = vmaxps_avx(auVar46,auVar56);
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar16 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar16 ^ 0x10));
            auVar57._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar57._4_4_ = fVar32 * pfVar2[1] + pfVar1[1];
            auVar57._8_4_ = fVar22 * pfVar2[2] + pfVar1[2];
            auVar57._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar23 = vsubps_avx(auVar57,auVar85._0_16_);
            auVar58._0_4_ = auVar81._0_4_ * auVar23._0_4_;
            auVar58._4_4_ = auVar81._4_4_ * auVar23._4_4_;
            auVar58._8_4_ = auVar81._8_4_ * auVar23._8_4_;
            auVar58._12_4_ = auVar81._12_4_ * auVar23._12_4_;
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar18 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar18 ^ 0x10));
            auVar63._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar63._4_4_ = fVar32 * pfVar2[1] + pfVar1[1];
            auVar63._8_4_ = fVar22 * pfVar2[2] + pfVar1[2];
            auVar63._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar23 = vsubps_avx(auVar63,auVar94._0_16_);
            auVar64._0_4_ = auVar83._0_4_ * auVar23._0_4_;
            auVar64._4_4_ = auVar83._4_4_ * auVar23._4_4_;
            auVar64._8_4_ = auVar83._8_4_ * auVar23._8_4_;
            auVar64._12_4_ = auVar83._12_4_ * auVar23._12_4_;
            pfVar2 = (float *)(uVar14 + 0x80 + (uVar17 ^ 0x10));
            pfVar1 = (float *)(uVar14 + 0x20 + (uVar17 ^ 0x10));
            auVar70._0_4_ = fVar42 * *pfVar2 + *pfVar1;
            auVar70._4_4_ = fVar32 * pfVar2[1] + pfVar1[1];
            auVar70._8_4_ = fVar22 * pfVar2[2] + pfVar1[2];
            auVar70._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar23 = vsubps_avx(auVar70,auVar76);
            auVar71._0_4_ = auVar89._0_4_ * auVar23._0_4_;
            auVar71._4_4_ = auVar89._4_4_ * auVar23._4_4_;
            auVar71._8_4_ = auVar89._8_4_ * auVar23._8_4_;
            auVar71._12_4_ = auVar89._12_4_ * auVar23._12_4_;
            auVar74 = vminps_avx(auVar64,auVar71);
            auVar23 = vmaxps_avx(auVar90._0_16_,auVar34);
            local_10e8 = vmaxps_avx(auVar23,auVar24);
            auVar24 = vminps_avx(auVar21._0_16_,auVar58);
            auVar24 = vminps_avx(auVar24,auVar74);
            if (uVar15 == 6) {
              auVar23 = vcmpps_avx(local_10e8,auVar24,2);
              auVar24 = vcmpps_avx(*(undefined1 (*) [16])(uVar14 + 0xe0),auVar44,2);
              auVar74 = vcmpps_avx(auVar44,*(undefined1 (*) [16])(uVar14 + 0xf0),1);
              auVar24 = vandps_avx(auVar24,auVar74);
              auVar24 = vandps_avx(auVar24,auVar23);
            }
            else {
              auVar24 = vcmpps_avx(local_10e8,auVar24,2);
            }
            auVar24 = vpslld_avx(auVar24,0x1f);
            uVar15 = vmovmskps_avx(auVar24);
          }
          in_R8 = (void *)CONCAT44((int)((ulong)in_R8 >> 0x20),uVar15);
          if (in_R8 == (void *)0x0) goto LAB_011d2dc3;
          lVar7 = 0;
          if (in_R8 != (void *)0x0) {
            for (; ((ulong)in_R8 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
            }
          }
          pvVar43 = *(void **)(uVar14 + lVar7 * 8);
          uVar15 = uVar15 - 1 & uVar15;
          if (uVar15 != 0) {
            uVar5 = *(uint *)(local_10e8 + lVar7 * 4);
            lVar7 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            in_R8 = *(void **)(uVar14 + lVar7 * 8);
            uVar6 = *(uint *)(local_10e8 + lVar7 * 4);
            uVar15 = uVar15 - 1 & uVar15;
            if (uVar15 == 0) {
              if (uVar5 < uVar6) {
                *(void **)*pauVar13 = in_R8;
                *(uint *)(*pauVar13 + 8) = uVar6;
                pauVar13 = pauVar13 + 1;
              }
              else {
                *(void **)*pauVar13 = pvVar43;
                *(uint *)(*pauVar13 + 8) = uVar5;
                pauVar13 = pauVar13 + 1;
                pvVar43 = in_R8;
              }
            }
            else {
              auVar28._8_8_ = 0;
              auVar28._0_8_ = pvVar43;
              auVar24 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar5));
              auVar38._8_8_ = 0;
              auVar38._0_8_ = in_R8;
              auVar23 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar6));
              lVar7 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              in_R8 = *(void **)(uVar14 + lVar7 * 8);
              auVar49._8_8_ = 0;
              auVar49._0_8_ = in_R8;
              auVar44 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_10e8 + lVar7 * 4)));
              auVar74 = vpcmpgtd_avx(auVar23,auVar24);
              uVar15 = uVar15 - 1 & uVar15;
              if (uVar15 == 0) {
                auVar19 = vpshufd_avx(auVar74,0xaa);
                auVar74 = vblendvps_avx(auVar23,auVar24,auVar19);
                auVar24 = vblendvps_avx(auVar24,auVar23,auVar19);
                auVar23 = vpcmpgtd_avx(auVar44,auVar74);
                auVar19 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar44,auVar74,auVar19);
                auVar74 = vblendvps_avx(auVar74,auVar44,auVar19);
                auVar44 = vpcmpgtd_avx(auVar74,auVar24);
                auVar19 = vpshufd_avx(auVar44,0xaa);
                auVar44 = vblendvps_avx(auVar74,auVar24,auVar19);
                auVar24 = vblendvps_avx(auVar24,auVar74,auVar19);
                *pauVar13 = auVar24;
                pauVar13[1] = auVar44;
                pvVar43 = auVar23._0_8_;
                pauVar13 = pauVar13 + 2;
              }
              else {
                lVar7 = 0;
                if (uVar15 != 0) {
                  for (; (uVar15 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                  }
                }
                auVar69._8_8_ = 0;
                auVar69._0_8_ = *(ulong *)(uVar14 + lVar7 * 8);
                auVar60 = vpunpcklqdq_avx(auVar69,ZEXT416(*(uint *)(local_10e8 + lVar7 * 4)));
                auVar19 = vpshufd_avx(auVar74,0xaa);
                auVar74 = vblendvps_avx(auVar23,auVar24,auVar19);
                auVar24 = vblendvps_avx(auVar24,auVar23,auVar19);
                auVar23 = vpcmpgtd_avx(auVar60,auVar44);
                auVar19 = vpshufd_avx(auVar23,0xaa);
                auVar23 = vblendvps_avx(auVar60,auVar44,auVar19);
                auVar44 = vblendvps_avx(auVar44,auVar60,auVar19);
                auVar19 = vpcmpgtd_avx(auVar44,auVar24);
                auVar60 = vpshufd_avx(auVar19,0xaa);
                auVar19 = vblendvps_avx(auVar44,auVar24,auVar60);
                auVar24 = vblendvps_avx(auVar24,auVar44,auVar60);
                auVar44 = vpcmpgtd_avx(auVar23,auVar74);
                auVar60 = vpshufd_avx(auVar44,0xaa);
                auVar44 = vblendvps_avx(auVar23,auVar74,auVar60);
                auVar23 = vblendvps_avx(auVar74,auVar23,auVar60);
                auVar74 = vpcmpgtd_avx(auVar19,auVar23);
                auVar60 = vpshufd_avx(auVar74,0xaa);
                auVar74 = vblendvps_avx(auVar19,auVar23,auVar60);
                auVar23 = vblendvps_avx(auVar23,auVar19,auVar60);
                *pauVar13 = auVar24;
                pauVar13[1] = auVar23;
                pauVar13[2] = auVar74;
                pvVar43 = auVar44._0_8_;
                pauVar13 = pauVar13 + 3;
              }
            }
          }
        }
        in_R8 = local_10c8->leafIntersector;
        (**(code **)((long)in_R8 + (ulong)*(byte *)((ulong)pvVar43 & 0xfffffffffffffff0) * 0x40))
                  (local_fb8,ray,local_10c0);
        auVar90 = ZEXT1664(local_10b8);
        auVar89 = ZEXT1664(local_10a8);
        auVar83 = ZEXT1664(local_1098);
        auVar81 = ZEXT1664(local_1088);
        auVar94 = ZEXT1664(local_1078);
        auVar85 = ZEXT1664(local_1068);
        fVar42 = (local_10d0->super_RayK<1>).tfar;
        auVar21 = ZEXT1664(CONCAT412(fVar42,CONCAT48(fVar42,CONCAT44(fVar42,fVar42))));
        ray = local_10d0;
      }
LAB_011d2dc3:
    } while (pauVar13 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }